

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

wchar_t f_cmp_fkind(void *a,void *b)

{
  wchar_t feat;
  feature *pfVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  
  pfVar1 = f_info;
  wVar4 = *a;
  feat = *b;
  wVar2 = feat_order(wVar4);
  wVar3 = feat_order(feat);
  if (wVar2 - wVar3 != L'\0') {
    return wVar2 - wVar3;
  }
  wVar4 = strcmp(pfVar1[wVar4].name,pfVar1[feat].name);
  return wVar4;
}

Assistant:

static int f_cmp_fkind(const void *a, const void *b)
{
	const int a_val = *(const int *)a;
	const int b_val = *(const int *)b;
	const struct feature *fa = &f_info[a_val];
	const struct feature *fb = &f_info[b_val];

	/* Group by */
	int c = feat_order(a_val) - feat_order(b_val);
	if (c) return c;

	/* Order by feature name */
	return strcmp(fa->name, fb->name);
}